

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

__pid_t __thiscall CSemaphore::wait(CSemaphore *this,void *__stat_loc)

{
  long in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex);
  std::condition_variable::wait<CSemaphore::wait()::_lambda()_1_>
            (&this->condition,&local_20,(anon_class_8_1_8991fb9c)this);
  this->value = this->value + -1;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (__pid_t)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void wait() noexcept
    {
        std::unique_lock<std::mutex> lock(mutex);
        condition.wait(lock, [&]() { return value >= 1; });
        value--;
    }